

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

FT_Error af_latin_hints_compute_segments(AF_GlyphHints hints,AF_Dimension dim)

{
  char cVar1;
  FT_Memory memory_00;
  AF_Point pAVar2;
  AF_Point pAVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined2 uVar7;
  bool bVar8;
  bool bVar9;
  FT_Error FVar10;
  AF_AxisHints axis_00;
  AF_Point_conflict *ppAVar11;
  AF_Point_conflict pAVar12;
  AF_Segment_conflict local_1f8;
  AF_Direction local_1ec;
  long local_1e8;
  long local_1d8;
  AF_Direction local_1d0;
  AF_Direction local_1cc;
  AF_Direction local_1c8;
  AF_Direction local_1c4;
  AF_Point_conflict p_1;
  AF_Point_conflict p;
  FT_Pos last_v;
  FT_Pos first_v;
  AF_Point_conflict last_1;
  AF_Point_conflict first;
  AF_Segment_conflict segments_end;
  AF_Segment_conflict segments;
  FT_Pos v;
  FT_Pos u;
  FT_Pos prev_max_on_coord;
  FT_Pos prev_min_on_coord;
  FT_UShort prev_max_flags;
  long lStack_158;
  FT_UShort prev_min_flags;
  FT_Pos prev_max_coord;
  FT_Pos prev_min_coord;
  FT_Pos prev_max_pos;
  FT_Pos prev_min_pos;
  AF_Segment_conflict prev_segment;
  long lStack_128;
  FT_Bool passed;
  FT_Pos max_on_coord;
  FT_Pos min_on_coord;
  FT_UShort max_flags;
  long lStack_110;
  FT_UShort min_flags;
  FT_Pos max_coord;
  FT_Pos min_coord;
  FT_Pos max_pos;
  FT_Pos min_pos;
  int on_edge;
  AF_Point_conflict last;
  AF_Point_conflict point_2;
  AF_Point_conflict limit_1;
  AF_Point_conflict point_1;
  AF_Point_conflict limit;
  AF_Point_conflict point;
  FT_Pos flat_threshold;
  AF_Direction segment_dir;
  AF_Direction major_dir;
  AF_Point_conflict *contour_limit;
  AF_Point_conflict *contour;
  AF_SegmentRec seg0;
  AF_Segment_conflict segment;
  FT_Error error;
  FT_Memory memory;
  AF_AxisHints axis;
  AF_LatinMetrics metrics;
  AF_Dimension dim_local;
  AF_GlyphHints hints_local;
  
  axis_00 = hints->axis + dim;
  memory_00 = hints->memory;
  seg0.last = (AF_Point_conflict)0x0;
  contour_limit = hints->contours;
  ppAVar11 = contour_limit + hints->num_contours;
  uVar6 = (ulong)*(uint *)&hints->metrics[1].style_class / 0xe;
  memset(&contour,0,0x50);
  seg0.serif = (AF_Segment)0x7d00;
  contour._0_1_ = 0;
  if (axis_00->major_dir < ~AF_DIR_LEFT) {
    local_1c4 = -axis_00->major_dir;
  }
  else {
    local_1c4 = axis_00->major_dir;
  }
  flat_threshold._0_4_ = local_1c4;
  axis_00->num_segments = 0;
  if (dim == AF_DIMENSION_HORZ) {
    limit = hints->points;
    pAVar12 = limit + hints->num_points;
    for (; limit < pAVar12; limit = limit + 1) {
      limit->u = (long)limit->fx;
      limit->v = (long)limit->fy;
    }
  }
  else {
    limit_1 = hints->points;
    pAVar12 = limit_1 + hints->num_points;
    for (; limit_1 < pAVar12; limit_1 = limit_1 + 1) {
      limit_1->u = (long)limit_1->fy;
      limit_1->v = (long)limit_1->fx;
    }
  }
LAB_0036ada4:
  if (ppAVar11 <= contour_limit) {
    seg0.last = (AF_Point_conflict)axis_00->segments;
    if ((AF_Segment_conflict)seg0.last == (AF_Segment_conflict)0x0) {
      local_1f8 = (AF_Segment_conflict)0x0;
    }
    else {
      local_1f8 = (AF_Segment_conflict)seg0.last + axis_00->num_segments;
    }
    for (; seg0.last < local_1f8; seg0.last = seg0.last + 1) {
      pAVar2 = (seg0.last)->next;
      pAVar3 = (seg0.last)->prev;
      lVar4 = pAVar2->v;
      lVar5 = pAVar3->v;
      if (lVar4 < lVar5) {
        if (pAVar2->prev->v < lVar4) {
          *(short *)((long)&(seg0.last)->ox + 2) =
               *(short *)((long)&(seg0.last)->ox + 2) + (short)(lVar4 - pAVar2->prev->v >> 1);
        }
        if (lVar5 < pAVar3->next->v) {
          *(short *)((long)&(seg0.last)->ox + 2) =
               *(short *)((long)&(seg0.last)->ox + 2) + (short)(pAVar3->next->v - lVar5 >> 1);
        }
      }
      else {
        if (lVar4 < pAVar2->prev->v) {
          *(short *)((long)&(seg0.last)->ox + 2) =
               *(short *)((long)&(seg0.last)->ox + 2) + (short)(pAVar2->prev->v - lVar4 >> 1);
        }
        if (pAVar3->next->v < lVar5) {
          *(short *)((long)&(seg0.last)->ox + 2) =
               *(short *)((long)&(seg0.last)->ox + 2) + (short)(lVar5 - pAVar3->next->v >> 1);
        }
      }
    }
    return 0;
  }
  pAVar2 = *contour_limit;
  pAVar3 = pAVar2->prev;
  bVar8 = false;
  max_pos = 32000;
  min_coord = -32000;
  max_coord = 32000;
  lStack_110 = -32000;
  min_on_coord._6_2_ = 0;
  min_on_coord._4_2_ = 0;
  max_on_coord = 32000;
  lStack_128 = -32000;
  prev_min_pos = 0;
  prev_max_pos = 32000;
  prev_min_coord = -32000;
  prev_max_coord = 32000;
  lStack_158 = -32000;
  prev_min_on_coord._6_2_ = 0;
  prev_min_on_coord._4_2_ = 0;
  prev_max_on_coord = 32000;
  u = -32000;
  if (pAVar3->out_dir < '\0') {
    local_1c8 = -(int)pAVar3->out_dir;
  }
  else {
    local_1c8 = (AF_Direction)pAVar3->out_dir;
  }
  last = pAVar2;
  if (local_1c8 == local_1c4) {
    if (pAVar2->out_dir < '\0') {
      local_1cc = -(int)pAVar2->out_dir;
    }
    else {
      local_1cc = (AF_Direction)pAVar2->out_dir;
    }
    if (local_1cc == local_1c4) {
      do {
        last = last->prev;
        if (last->out_dir < '\0') {
          local_1d0 = -(int)last->out_dir;
        }
        else {
          local_1d0 = (AF_Direction)last->out_dir;
        }
        if (local_1d0 != local_1c4) {
          last = last->next;
          break;
        }
      } while (last != pAVar2);
    }
  }
  pAVar12 = last;
  bVar9 = false;
  do {
    if (bVar8) {
      lVar4 = last->u;
      if (lVar4 < max_pos) {
        max_pos = lVar4;
      }
      if (min_coord < lVar4) {
        min_coord = lVar4;
      }
      lVar4 = last->v;
      if (lVar4 < max_coord) {
        min_on_coord._6_2_ = last->flags;
        max_coord = lVar4;
      }
      if (lStack_110 < lVar4) {
        min_on_coord._4_2_ = last->flags;
        lStack_110 = lVar4;
      }
      if ((last->flags & 3) == 0) {
        lVar4 = last->v;
        if (lVar4 < max_on_coord) {
          max_on_coord = lVar4;
        }
        if (lStack_128 < lVar4) {
          lStack_128 = lVar4;
        }
      }
      if ((last->out_dir != (AF_Direction)flat_threshold) || (last == pAVar12)) {
        if ((prev_min_pos == 0) || ((seg0.last)->next != *(AF_Point *)(prev_min_pos + 0x48))) {
          (seg0.last)->prev = last;
          uVar7 = (undefined2)(max_pos + min_coord >> 1);
          (seg0.last)->in_dir = (char)uVar7;
          (seg0.last)->out_dir = (char)((ushort)uVar7 >> 8);
          *(short *)&(seg0.last)->field_0x4 = (short)(min_coord - max_pos >> 1);
          if ((((min_on_coord._6_2_ | min_on_coord._4_2_) & 3) != 0) &&
             (lStack_128 - max_on_coord < (long)uVar6)) {
            *(byte *)&(seg0.last)->flags = (byte)(seg0.last)->flags | 1;
          }
          *(short *)&(seg0.last)->field_0x6 = (short)max_coord;
          *(short *)&(seg0.last)->ox = (short)lStack_110;
          *(short *)((long)&(seg0.last)->ox + 2) =
               (short)(seg0.last)->ox - *(short *)&(seg0.last)->field_0x6;
          prev_min_pos = (FT_Pos)seg0.last;
          prev_max_pos = max_pos;
          prev_min_coord = min_coord;
          prev_max_coord = max_coord;
          lStack_158 = lStack_110;
          prev_min_on_coord._6_2_ = min_on_coord._6_2_;
          prev_min_on_coord._4_2_ = min_on_coord._4_2_;
          prev_max_on_coord = max_on_coord;
          u = lStack_128;
        }
        else {
          if (*(char *)(*(long *)(prev_min_pos + 0x48) + 2) == last->in_dir) {
            if (prev_max_pos < max_pos) {
              max_pos = prev_max_pos;
            }
            if (min_coord < prev_min_coord) {
              min_coord = prev_min_coord;
            }
            if (prev_max_coord < max_coord) {
              max_coord = prev_max_coord;
              min_on_coord._6_2_ = prev_min_on_coord._6_2_;
            }
            if (lStack_110 < lStack_158) {
              lStack_110 = lStack_158;
              min_on_coord._4_2_ = prev_min_on_coord._4_2_;
            }
            if (prev_max_on_coord < max_on_coord) {
              max_on_coord = prev_max_on_coord;
            }
            if (lStack_128 < u) {
              lStack_128 = u;
            }
            *(AF_Point_conflict *)(prev_min_pos + 0x48) = last;
            *(short *)(prev_min_pos + 2) = (short)(max_pos + min_coord >> 1);
            *(short *)(prev_min_pos + 4) = (short)(min_coord - max_pos >> 1);
            if ((((min_on_coord._6_2_ | min_on_coord._4_2_) & 3) == 0) ||
               ((long)uVar6 <= lStack_128 - max_on_coord)) {
              *(byte *)prev_min_pos = *(byte *)prev_min_pos & 0xfe;
            }
            else {
              *(byte *)prev_min_pos = *(byte *)prev_min_pos | 1;
            }
            *(short *)(prev_min_pos + 6) = (short)max_coord;
            *(short *)(prev_min_pos + 8) = (short)lStack_110;
            *(short *)(prev_min_pos + 10) =
                 *(short *)(prev_min_pos + 8) - *(short *)(prev_min_pos + 6);
          }
          else {
            if (lStack_158 - prev_max_coord < 0) {
              local_1d8 = -(lStack_158 - prev_max_coord);
            }
            else {
              local_1d8 = lStack_158 - prev_max_coord;
            }
            if (lStack_110 - max_coord < 0) {
              local_1e8 = -(lStack_110 - max_coord);
            }
            else {
              local_1e8 = lStack_110 - max_coord;
            }
            if (local_1e8 < local_1d8) {
              if (max_pos < prev_max_pos) {
                prev_max_pos = max_pos;
              }
              if (prev_min_coord < min_coord) {
                prev_min_coord = min_coord;
              }
              *(AF_Point_conflict *)(prev_min_pos + 0x48) = last;
              *(short *)(prev_min_pos + 2) = (short)(prev_max_pos + prev_min_coord >> 1);
              *(short *)(prev_min_pos + 4) = (short)(prev_min_coord - prev_max_pos >> 1);
            }
            else {
              if (prev_max_pos < max_pos) {
                max_pos = prev_max_pos;
              }
              if (min_coord < prev_min_coord) {
                min_coord = prev_min_coord;
              }
              (seg0.last)->prev = last;
              uVar7 = (undefined2)(max_pos + min_coord >> 1);
              (seg0.last)->in_dir = (char)uVar7;
              (seg0.last)->out_dir = (char)((ushort)uVar7 >> 8);
              *(short *)&(seg0.last)->field_0x4 = (short)(min_coord - max_pos >> 1);
              if ((((min_on_coord._6_2_ | min_on_coord._4_2_) & 3) != 0) &&
                 (lStack_128 - max_on_coord < (long)uVar6)) {
                *(byte *)&(seg0.last)->flags = (byte)(seg0.last)->flags | 1;
              }
              *(short *)&(seg0.last)->field_0x6 = (short)max_coord;
              *(short *)&(seg0.last)->ox = (short)lStack_110;
              *(short *)((long)&(seg0.last)->ox + 2) =
                   (short)(seg0.last)->ox - *(short *)&(seg0.last)->field_0x6;
              memcpy((void *)prev_min_pos,seg0.last,0x50);
              prev_max_pos = max_pos;
              prev_min_coord = min_coord;
              prev_max_coord = max_coord;
              lStack_158 = lStack_110;
              prev_min_on_coord._6_2_ = min_on_coord._6_2_;
              prev_min_on_coord._4_2_ = min_on_coord._4_2_;
              prev_max_on_coord = max_on_coord;
              u = lStack_128;
            }
          }
          axis_00->num_segments = axis_00->num_segments - 1;
        }
        bVar8 = false;
        seg0.last = (AF_Point_conflict)0x0;
      }
    }
    if (last == pAVar12) {
      if (bVar9) break;
      bVar9 = true;
    }
    if (!bVar8) {
      if (last->out_dir < '\0') {
        local_1ec = -(int)last->out_dir;
      }
      else {
        local_1ec = (AF_Direction)last->out_dir;
      }
      if ((local_1ec == local_1c4) || (last == last->prev)) {
        if (1000 < axis_00->num_segments) {
          axis_00->num_segments = 0;
          return 0;
        }
        cVar1 = last->out_dir;
        flat_threshold._0_4_ = (AF_Direction)cVar1;
        FVar10 = af_axis_hints_new_segment(axis_00,memory_00,(AF_Segment_conflict *)&seg0.last);
        if (FVar10 != 0) {
          return FVar10;
        }
        memcpy(seg0.last,&contour,0x50);
        *(char *)((long)&(seg0.last)->flags + 1) = cVar1;
        (seg0.last)->next = last;
        (seg0.last)->prev = last;
        if (prev_min_pos != 0) {
          prev_min_pos = (FT_Pos)(seg0.last + -1);
        }
        min_coord = last->u;
        lStack_110 = last->v;
        min_on_coord._4_2_ = last->flags;
        if ((last->flags & 3) == 0) {
          lStack_128 = last->v;
          max_on_coord = lStack_128;
        }
        else {
          max_on_coord = 32000;
          lStack_128 = -32000;
        }
        bVar8 = true;
        min_on_coord._6_2_ = min_on_coord._4_2_;
        max_coord = lStack_110;
        max_pos = min_coord;
        if (last == last->prev) {
          (seg0.last)->in_dir = (char)(short)min_coord;
          (seg0.last)->out_dir = (char)((ushort)(short)min_coord >> 8);
          if ((last->flags & 3) != 0) {
            *(byte *)&(seg0.last)->flags = (byte)(seg0.last)->flags | 1;
          }
          *(short *)&(seg0.last)->field_0x6 = (short)last->v;
          *(short *)&(seg0.last)->ox = (short)last->v;
          *(undefined2 *)((long)&(seg0.last)->ox + 2) = 0;
          bVar8 = false;
          seg0.last = (AF_Point_conflict)0x0;
        }
      }
    }
    last = last->next;
  } while( true );
  contour_limit = contour_limit + 1;
  goto LAB_0036ada4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_hints_compute_segments( AF_GlyphHints  hints,
                                   AF_Dimension   dim )
  {
    AF_LatinMetrics  metrics       = (AF_LatinMetrics)hints->metrics;
    AF_AxisHints     axis          = &hints->axis[dim];
    FT_Memory        memory        = hints->memory;
    FT_Error         error         = FT_Err_Ok;
    AF_Segment       segment       = NULL;
    AF_SegmentRec    seg0;
    AF_Point*        contour       = hints->contours;
    AF_Point*        contour_limit = contour + hints->num_contours;
    AF_Direction     major_dir, segment_dir;

    FT_Pos  flat_threshold = FLAT_THRESHOLD( metrics->units_per_em );


    FT_ZERO( &seg0 );
    seg0.score = 32000;
    seg0.flags = AF_EDGE_NORMAL;

    major_dir   = (AF_Direction)FT_ABS( axis->major_dir );
    segment_dir = major_dir;

    axis->num_segments = 0;

    /* set up (u,v) in each point */
    if ( dim == AF_DIMENSION_HORZ )
    {
      AF_Point  point = hints->points;
      AF_Point  limit = point + hints->num_points;


      for ( ; point < limit; point++ )
      {
        point->u = point->fx;
        point->v = point->fy;
      }
    }
    else
    {
      AF_Point  point = hints->points;
      AF_Point  limit = point + hints->num_points;


      for ( ; point < limit; point++ )
      {
        point->u = point->fy;
        point->v = point->fx;
      }
    }

    /* do each contour separately */
    for ( ; contour < contour_limit; contour++ )
    {
      AF_Point  point   = contour[0];
      AF_Point  last    = point->prev;
      int       on_edge = 0;

      /* we call values measured along a segment (point->v)    */
      /* `coordinates', and values orthogonal to it (point->u) */
      /* `positions'                                           */
      FT_Pos     min_pos      =  32000;
      FT_Pos     max_pos      = -32000;
      FT_Pos     min_coord    =  32000;
      FT_Pos     max_coord    = -32000;
      FT_UShort  min_flags    =  AF_FLAG_NONE;
      FT_UShort  max_flags    =  AF_FLAG_NONE;
      FT_Pos     min_on_coord =  32000;
      FT_Pos     max_on_coord = -32000;

      FT_Bool  passed;

      AF_Segment  prev_segment = NULL;

      FT_Pos     prev_min_pos      = min_pos;
      FT_Pos     prev_max_pos      = max_pos;
      FT_Pos     prev_min_coord    = min_coord;
      FT_Pos     prev_max_coord    = max_coord;
      FT_UShort  prev_min_flags    = min_flags;
      FT_UShort  prev_max_flags    = max_flags;
      FT_Pos     prev_min_on_coord = min_on_coord;
      FT_Pos     prev_max_on_coord = max_on_coord;


      if ( FT_ABS( last->out_dir )  == major_dir &&
           FT_ABS( point->out_dir ) == major_dir )
      {
        /* we are already on an edge, try to locate its start */
        last = point;

        for (;;)
        {
          point = point->prev;
          if ( FT_ABS( point->out_dir ) != major_dir )
          {
            point = point->next;
            break;
          }
          if ( point == last )
            break;
        }
      }

      last   = point;
      passed = 0;

      for (;;)
      {
        FT_Pos  u, v;


        if ( on_edge )
        {
          /* get minimum and maximum position */
          u = point->u;
          if ( u < min_pos )
            min_pos = u;
          if ( u > max_pos )
            max_pos = u;

          /* get minimum and maximum coordinate together with flags */
          v = point->v;
          if ( v < min_coord )
          {
            min_coord = v;
            min_flags = point->flags;
          }
          if ( v > max_coord )
          {
            max_coord = v;
            max_flags = point->flags;
          }

          /* get minimum and maximum coordinate of `on' points */
          if ( !( point->flags & AF_FLAG_CONTROL ) )
          {
            v = point->v;
            if ( v < min_on_coord )
              min_on_coord = v;
            if ( v > max_on_coord )
              max_on_coord = v;
          }

          if ( point->out_dir != segment_dir || point == last )
          {
            /* check whether the new segment's start point is identical to */
            /* the previous segment's end point; for example, this might   */
            /* happen for spikes                                           */

            if ( !prev_segment || segment->first != prev_segment->last )
            {
              /* points are different: we are just leaving an edge, thus */
              /* record a new segment                                    */

              segment->last  = point;
              segment->pos   = (FT_Short)( ( min_pos + max_pos ) >> 1 );
              segment->delta = (FT_Short)( ( max_pos - min_pos ) >> 1 );

              /* a segment is round if either its first or last point */
              /* is a control point, and the length of the on points  */
              /* inbetween doesn't exceed a heuristic limit           */
              if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                   ( max_on_coord - min_on_coord ) < flat_threshold )
                segment->flags |= AF_EDGE_ROUND;

              segment->min_coord = (FT_Short)min_coord;
              segment->max_coord = (FT_Short)max_coord;
              segment->height    = segment->max_coord - segment->min_coord;

              prev_segment      = segment;
              prev_min_pos      = min_pos;
              prev_max_pos      = max_pos;
              prev_min_coord    = min_coord;
              prev_max_coord    = max_coord;
              prev_min_flags    = min_flags;
              prev_max_flags    = max_flags;
              prev_min_on_coord = min_on_coord;
              prev_max_on_coord = max_on_coord;
            }
            else
            {
              /* points are the same: we don't create a new segment but */
              /* merge the current segment with the previous one        */

              if ( prev_segment->last->in_dir == point->in_dir )
              {
                /* we have identical directions (this can happen for       */
                /* degenerate outlines that move zig-zag along the main    */
                /* axis without changing the coordinate value of the other */
                /* axis, and where the segments have just been merged):    */
                /* unify segments                                          */

                /* update constraints */

                if ( prev_min_pos < min_pos )
                  min_pos = prev_min_pos;
                if ( prev_max_pos > max_pos )
                  max_pos = prev_max_pos;

                if ( prev_min_coord < min_coord )
                {
                  min_coord = prev_min_coord;
                  min_flags = prev_min_flags;
                }
                if ( prev_max_coord > max_coord )
                {
                  max_coord = prev_max_coord;
                  max_flags = prev_max_flags;
                }

                if ( prev_min_on_coord < min_on_coord )
                  min_on_coord = prev_min_on_coord;
                if ( prev_max_on_coord > max_on_coord )
                  max_on_coord = prev_max_on_coord;

                prev_segment->last  = point;
                prev_segment->pos   = (FT_Short)( ( min_pos +
                                                    max_pos ) >> 1 );
                prev_segment->delta = (FT_Short)( ( max_pos -
                                                    min_pos ) >> 1 );

                if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                     ( max_on_coord - min_on_coord ) < flat_threshold )
                  prev_segment->flags |= AF_EDGE_ROUND;
                else
                  prev_segment->flags &= ~AF_EDGE_ROUND;

                prev_segment->min_coord = (FT_Short)min_coord;
                prev_segment->max_coord = (FT_Short)max_coord;
                prev_segment->height    = prev_segment->max_coord -
                                          prev_segment->min_coord;
              }
              else
              {
                /* we have different directions; use the properties of the */
                /* longer segment and discard the other one                */

                if ( FT_ABS( prev_max_coord - prev_min_coord ) >
                     FT_ABS( max_coord - min_coord ) )
                {
                  /* discard current segment */

                  if ( min_pos < prev_min_pos )
                    prev_min_pos = min_pos;
                  if ( max_pos > prev_max_pos )
                    prev_max_pos = max_pos;

                  prev_segment->last  = point;
                  prev_segment->pos   = (FT_Short)( ( prev_min_pos +
                                                      prev_max_pos ) >> 1 );
                  prev_segment->delta = (FT_Short)( ( prev_max_pos -
                                                      prev_min_pos ) >> 1 );
                }
                else
                {
                  /* discard previous segment */

                  if ( prev_min_pos < min_pos )
                    min_pos = prev_min_pos;
                  if ( prev_max_pos > max_pos )
                    max_pos = prev_max_pos;

                  segment->last  = point;
                  segment->pos   = (FT_Short)( ( min_pos + max_pos ) >> 1 );
                  segment->delta = (FT_Short)( ( max_pos - min_pos ) >> 1 );

                  if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                       ( max_on_coord - min_on_coord ) < flat_threshold )
                    segment->flags |= AF_EDGE_ROUND;

                  segment->min_coord = (FT_Short)min_coord;
                  segment->max_coord = (FT_Short)max_coord;
                  segment->height    = segment->max_coord -
                                       segment->min_coord;

                  *prev_segment = *segment;

                  prev_min_pos      = min_pos;
                  prev_max_pos      = max_pos;
                  prev_min_coord    = min_coord;
                  prev_max_coord    = max_coord;
                  prev_min_flags    = min_flags;
                  prev_max_flags    = max_flags;
                  prev_min_on_coord = min_on_coord;
                  prev_max_on_coord = max_on_coord;
                }
              }

              axis->num_segments--;
            }

            on_edge = 0;
            segment = NULL;

            /* fall through */
          }
        }

        /* now exit if we are at the start/end point */
        if ( point == last )
        {
          if ( passed )
            break;
          passed = 1;
        }

        /* if we are not on an edge, check whether the major direction */
        /* coincides with the current point's `out' direction, or      */
        /* whether we have a single-point contour                      */
        if ( !on_edge                                  &&
             ( FT_ABS( point->out_dir ) == major_dir ||
               point == point->prev                  ) )
        {
          /*
           * For efficiency, we restrict the number of segments to 1000,
           * which is a heuristic value: it is very unlikely that a glyph
           * with so many segments can be hinted in a sensible way.
           * Reasons:
           *
           * - The glyph has really 1000 segments; this implies that it has
           *   at least 2000 outline points.  Assuming 'normal' fonts that
           *   have superfluous points optimized away, viewing such a glyph
           *   only makes sense at large magnifications where hinting
           *   isn't applied anyway.
           *
           * - We have a broken glyph.  Hinting doesn't make sense in this
           *   case either.
           */
          if ( axis->num_segments > 1000 )
          {
            FT_TRACE0(( "af_latin_hints_compute_segments:"
                        " more than 1000 segments in this glyph;\n" ));
            FT_TRACE0(( "                                "
                        " hinting is suppressed\n" ));
            axis->num_segments = 0;
            return FT_Err_Ok;
          }

          /* this is the start of a new segment! */
          segment_dir = (AF_Direction)point->out_dir;

          error = af_axis_hints_new_segment( axis, memory, &segment );
          if ( error )
            goto Exit;

          /* clear all segment fields */
          segment[0] = seg0;

          segment->dir   = (FT_Char)segment_dir;
          segment->first = point;
          segment->last  = point;

          /* `af_axis_hints_new_segment' reallocates memory,    */
          /* thus we have to refresh the `prev_segment' pointer */
          if ( prev_segment )
            prev_segment = segment - 1;

          min_pos   = max_pos   = point->u;
          min_coord = max_coord = point->v;
          min_flags = max_flags = point->flags;

          if ( point->flags & AF_FLAG_CONTROL )
          {
            min_on_coord =  32000;
            max_on_coord = -32000;
          }
          else
            min_on_coord = max_on_coord = point->v;

          on_edge = 1;

          if ( point == point->prev )
          {
            /* we have a one-point segment: this is a one-point */
            /* contour with `in' and `out' direction set to     */
            /* AF_DIR_NONE                                      */
            segment->pos = (FT_Short)min_pos;

            if (point->flags & AF_FLAG_CONTROL)
              segment->flags |= AF_EDGE_ROUND;

            segment->min_coord = (FT_Short)point->v;
            segment->max_coord = (FT_Short)point->v;
            segment->height = 0;

            on_edge = 0;
            segment = NULL;
          }
        }

        point = point->next;
      }

    } /* contours */


    /* now slightly increase the height of segments if this makes */
    /* sense -- this is used to better detect and ignore serifs   */
    {
      AF_Segment  segments     = axis->segments;
      AF_Segment  segments_end = FT_OFFSET( segments, axis->num_segments );


      for ( segment = segments; segment < segments_end; segment++ )
      {
        AF_Point  first   = segment->first;
        AF_Point  last    = segment->last;
        FT_Pos    first_v = first->v;
        FT_Pos    last_v  = last->v;


        if ( first_v < last_v )
        {
          AF_Point  p;


          p = first->prev;
          if ( p->v < first_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( first_v - p->v ) >> 1 ) );

          p = last->next;
          if ( p->v > last_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( p->v - last_v ) >> 1 ) );
        }
        else
        {
          AF_Point  p;


          p = first->prev;
          if ( p->v > first_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( p->v - first_v ) >> 1 ) );

          p = last->next;
          if ( p->v < last_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( last_v - p->v ) >> 1 ) );
        }
      }
    }

  Exit:
    return error;
  }